

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cc
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  initializer_list<const_SSM::Observable_*> __l;
  byte bVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  reference ppOVar6;
  function<int_(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  local_228;
  ResultHandler *local_208;
  code *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [8];
  type callback;
  ResultHandler handler;
  int local_1ac;
  vector local_1a8 [4];
  int i;
  Values values;
  allocator<const_SSM::Observable_*> local_189;
  Observable *local_188;
  ManifoldRelativePressure *local_180;
  ManifoldRelativePressure *local_178;
  ExhaustGasTemperature *local_170;
  IntakeAirTemperature *local_168;
  AirFuelLeanCorrection *local_160;
  EngineLoad *local_158;
  ThrottlePedal *local_150;
  KnockingCorrection *local_148;
  NeutralPositionSwitch *local_140;
  KnockSignal1 *local_138;
  pointer *local_130;
  iterator local_128;
  size_type local_120;
  undefined1 local_118 [8];
  Observables observables;
  KnockSignal2 knock_2;
  KnockSignal1 knock_1;
  NeutralPositionSwitch nt_sw;
  KnockingCorrection kn_corr;
  ThrottlePedal thr;
  EngineLoad en_load;
  AirFuelLeanCorrection af_lean_corr;
  IntakeAirTemperature intake_temp;
  ExhaustGasTemperature exhaust_gas_temp;
  ManifoldRelativePressure manifold_pressure;
  EngineSpeed engine_speed;
  BatteryVoltage battery_voltage;
  allocator<char> local_89;
  string local_88 [32];
  Observable local_68;
  ECUPort ECU;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"/dev/ttyUSB0",&local_89);
  SSM::ECUPort::ECUPort((ECUPort *)&local_68,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  SSM::BatteryVoltage::BatteryVoltage((BatteryVoltage *)&engine_speed);
  SSM::EngineSpeed::EngineSpeed((EngineSpeed *)&manifold_pressure);
  SSM::ManifoldRelativePressure::ManifoldRelativePressure
            ((ManifoldRelativePressure *)&exhaust_gas_temp);
  SSM::ExhaustGasTemperature::ExhaustGasTemperature((ExhaustGasTemperature *)&intake_temp);
  SSM::IntakeAirTemperature::IntakeAirTemperature((IntakeAirTemperature *)&af_lean_corr);
  SSM::AirFuelLeanCorrection::AirFuelLeanCorrection((AirFuelLeanCorrection *)&en_load);
  SSM::EngineLoad::EngineLoad((EngineLoad *)&thr);
  SSM::ThrottlePedal::ThrottlePedal((ThrottlePedal *)&kn_corr);
  SSM::KnockingCorrection::KnockingCorrection((KnockingCorrection *)&nt_sw);
  SSM::NeutralPositionSwitch::NeutralPositionSwitch((NeutralPositionSwitch *)&knock_1);
  SSM::KnockSignal1::KnockSignal1((KnockSignal1 *)&knock_2);
  this = &observables.
          super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  SSM::KnockSignal2::KnockSignal2((KnockSignal2 *)this);
  local_128 = &local_188;
  local_120 = 0xc;
  local_188 = (Observable *)&engine_speed;
  local_180 = &manifold_pressure;
  local_178 = (ManifoldRelativePressure *)&exhaust_gas_temp;
  local_170 = (ExhaustGasTemperature *)&intake_temp;
  local_168 = (IntakeAirTemperature *)&af_lean_corr;
  local_160 = (AirFuelLeanCorrection *)&en_load;
  local_158 = (EngineLoad *)&thr;
  local_150 = (ThrottlePedal *)&kn_corr;
  local_148 = (KnockingCorrection *)&nt_sw;
  local_140 = (NeutralPositionSwitch *)&knock_1;
  local_138 = (KnockSignal1 *)&knock_2;
  local_130 = this;
  std::allocator<const_SSM::Observable_*>::allocator(&local_189);
  __l._M_len = local_120;
  __l._M_array = local_128;
  std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::vector
            ((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_> *)local_118,
             __l,&local_189);
  std::allocator<const_SSM::Observable_*>::~allocator(&local_189);
  SSM::ECUPort::singleRead(local_1a8);
  sVar2 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::size
                    ((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_> *)
                     local_118);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_1a8);
  if (sVar2 == sVar3) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Single read results:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1ac = 0;
    while( true ) {
      sVar2 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_1a8);
      if (sVar2 <= (ulong)(long)local_1ac) break;
      std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::operator[]
                ((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_> *)
                 local_118,(long)local_1ac);
      bVar1 = SSM::ECUPort::isAvailable(&local_68);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(bool)(bVar1 & 1));
      poVar4 = std::operator<<(poVar4," | ");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_1a8,(long)local_1ac);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
      poVar4 = std::operator<<(poVar4," ");
      ppOVar6 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::
                operator[]((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                            *)local_118,(long)local_1ac);
      (*(*ppOVar6)->_vptr_Observable[1])(&handler);
      poVar4 = std::operator<<(poVar4,(string *)&handler);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&handler);
      local_1ac = local_1ac + 1;
    }
    ResultHandler::ResultHandler((ResultHandler *)&callback._M_bound_args,100);
    local_200 = ResultHandler::handle;
    local_1f8 = 0;
    local_208 = (ResultHandler *)&callback._M_bound_args;
    std::
    bind<int(ResultHandler::*)(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&),ResultHandler*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((type *)local_1f0,(offset_in_ResultHandler_to_subr *)&local_200,&local_208,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    poVar4 = std::operator<<((ostream *)&std::cout,"\nStarting continuous read:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::
    function<int(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&)>
    ::
    function<std::_Bind<int(ResultHandler::*(ResultHandler*,std::_Placeholder<1>,std::_Placeholder<2>))(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&)>&,void>
              ((function<int(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&)>
                *)&local_228,
               (_Bind<int_(ResultHandler::*(ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                *)local_1f0);
    SSM::ECUPort::continuousRead(&local_68,local_118,&local_228);
    std::
    function<int_(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::~function(&local_228);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_1a8);
    std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::~vector
              ((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_> *)
               local_118);
    SSM::ECUPort::~ECUPort((ECUPort *)&local_68);
    return 0;
  }
  __assert_fail("observables.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Silvan-K[P]libsubarussm/src/Example.cc"
                ,0x3f,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv)
{
  SSM::ECUPort ECU("/dev/ttyUSB0");

  SSM::BatteryVoltage           battery_voltage;
  SSM::EngineSpeed              engine_speed;
  SSM::ManifoldRelativePressure manifold_pressure;
  SSM::ExhaustGasTemperature    exhaust_gas_temp;
  SSM::IntakeAirTemperature     intake_temp;
  SSM::AirFuelLeanCorrection    af_lean_corr;
  SSM::EngineLoad               en_load;
  SSM::ThrottlePedal            thr;
  SSM::KnockingCorrection       kn_corr;
  SSM::NeutralPositionSwitch    nt_sw;
  SSM::KnockSignal1             knock_1;
  SSM::KnockSignal2             knock_2;
  
  SSM::Observables observables { &battery_voltage,
				 &engine_speed,
				 &manifold_pressure,
				 &exhaust_gas_temp,
				 &intake_temp,
				 &af_lean_corr,
				 &en_load,
				 &thr,
				 &kn_corr,
				 &nt_sw,
				 &knock_1,
				 &knock_2 };

  SSM::Values values = ECU.singleRead(observables);
  assert(observables.size() == values.size());

  std::cout << "Single read results:" << std::endl;
  for(int i(0); i<values.size(); i++)
    std::cout << ECU.isAvailable(*observables[i])
	      << " | " << values[i] << " "
	      << observables[i]->unit() << std::endl;

  ResultHandler handler(100);
  auto callback = std::bind(&ResultHandler::handle, 
			    &handler, 
			    std::placeholders::_1,
			    std::placeholders::_2);

  std::cout << "\nStarting continuous read:" << std::endl;
  ECU.continuousRead(observables, callback);
}